

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.cc
# Opt level: O0

uint64_t __thiscall
bloaty::RangeMap::
TranslateWithEntry<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
          (RangeMap *this,
          _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> iter,
          uint64_t addr)

{
  unsigned_long uVar1;
  bool bVar2;
  pointer ppVar3;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *in_RDX;
  RangeMap *in_RSI;
  uint64_t in_RDI;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> unaff_retaddr;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
  *in_stack_ffffffffffffffd0;
  
  bVar2 = EntryContains<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                    (in_RSI,unaff_retaddr,in_RDI);
  if (!bVar2) {
    __assert_fail("EntryContains(iter, addr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.cc"
                  ,0x19,
                  "uint64_t bloaty::RangeMap::TranslateWithEntry(T, uint64_t) const [T = std::_Rb_tree_const_iterator<std::pair<const unsigned long, bloaty::RangeMap::Entry>>]"
                 );
  }
  ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
           operator->(in_stack_ffffffffffffffd0);
  bVar2 = Entry::HasTranslation(&ppVar3->second);
  if (!bVar2) {
    __assert_fail("iter->second.HasTranslation()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.cc"
                  ,0x1a,
                  "uint64_t bloaty::RangeMap::TranslateWithEntry(T, uint64_t) const [T = std::_Rb_tree_const_iterator<std::pair<const unsigned long, bloaty::RangeMap::Entry>>]"
                 );
  }
  ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
           operator->(in_RDX);
  uVar1 = ppVar3->first;
  ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
           operator->(in_RDX);
  return (long)in_RDX + ((ppVar3->second).other_start - uVar1);
}

Assistant:

uint64_t RangeMap::TranslateWithEntry(T iter, uint64_t addr) const {
  assert(EntryContains(iter, addr));
  assert(iter->second.HasTranslation());
  return addr - iter->first + iter->second.other_start;
}